

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O3

string * __thiscall
cmQtAutoGenInitializer::InfoWriter::
ListJoin<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (string *__return_storage_ptr__,InfoWriter *this,
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          it_begin,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   it_end)

{
  byte bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  byte *pbVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this !=
      it_begin._M_current) {
    do {
      if (pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      pbVar3 = (byte *)(pbVar2->_M_dataplus)._M_p;
LAB_0034d432:
      bVar1 = *pbVar3;
      if (0x3a < bVar1) {
        if ((bVar1 == 0x3b) || (bVar1 == 0x5c)) goto LAB_0034d467;
LAB_0034d474:
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
LAB_0034d46f:
        pbVar3 = pbVar3 + 1;
        goto LAB_0034d432;
      }
      if ((bVar1 == 0x22) || (bVar1 == 0x24)) {
LAB_0034d467:
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        goto LAB_0034d46f;
      }
      if (bVar1 != 0) goto LAB_0034d474;
      pbVar2 = pbVar2 + 1;
    } while (pbVar2 != it_begin._M_current);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGenInitializer::InfoWriter::ListJoin(IT it_begin,
                                                         IT it_end)
{
  std::string res;
  for (IT it = it_begin; it != it_end; ++it) {
    if (it != it_begin) {
      res += ';';
    }
    for (const char* c = it->c_str(); *c; ++c) {
      if (*c == '"') {
        // Escape the double quote to avoid ending the argument.
        res += "\\\"";
      } else if (*c == '$') {
        // Escape the dollar to avoid expanding variables.
        res += "\\$";
      } else if (*c == '\\') {
        // Escape the backslash to avoid other escapes.
        res += "\\\\";
      } else if (*c == ';') {
        // Escape the semicolon to avoid list expansion.
        res += "\\;";
      } else {
        // Other characters will be parsed correctly.
        res += *c;
      }
    }
  }
  return res;
}